

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::NewKey
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key)

{
  Node *pNVar1;
  char *pcVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  uint uVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  
  pNVar6 = this->Nodes;
  uVar7 = this->Size - 1;
  uVar9 = uVar7 & key;
  pNVar12 = pNVar6 + uVar9;
  pNVar8 = pNVar12->Next;
  if (pNVar8 == (Node *)0x1) {
    pNVar12->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar10 = pNVar1 + -1;
      pNVar11 = (Node *)0x0;
      if (pNVar1 <= pNVar6) break;
      pNVar11 = pNVar10;
      pNVar1 = pNVar10;
    } while (pNVar10->Next != (Node *)0x1);
    this->LastFree = pNVar10;
    if (pNVar11 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar6 = NewKey(this,key);
    }
    else {
      uVar7 = uVar7 & (pNVar12->Pair).Key;
      if (uVar7 == uVar9) {
        pNVar11->Next = pNVar8;
        pNVar6 = pNVar11;
        pNVar8 = pNVar11;
      }
      else {
        pNVar6 = pNVar6 + uVar7;
        do {
          pNVar8 = pNVar6;
          pNVar6 = pNVar8->Next;
        } while (pNVar6 != pNVar12);
        pNVar8->Next = pNVar11;
        uVar3 = *(undefined4 *)&(pNVar12->Pair).Value.field_0x14;
        (pNVar11->Pair).Value.linenum = (pNVar12->Pair).Value.linenum;
        *(undefined4 *)&(pNVar11->Pair).Value.field_0x14 = uVar3;
        pNVar6 = pNVar12->Next;
        iVar4 = (pNVar12->Pair).Key;
        uVar5 = *(undefined4 *)&(pNVar12->Pair).field_0x4;
        uVar3 = *(undefined4 *)&(pNVar12->Pair).Value.field_0x4;
        pcVar2 = (pNVar12->Pair).Value.filename.Chars;
        (pNVar11->Pair).Value.classname = (FName)(pNVar12->Pair).Value.classname.Index;
        *(undefined4 *)&(pNVar11->Pair).Value.field_0x4 = uVar3;
        (pNVar11->Pair).Value.filename.Chars = pcVar2;
        pNVar11->Next = pNVar6;
        (pNVar11->Pair).Key = iVar4;
        *(undefined4 *)&(pNVar11->Pair).field_0x4 = uVar5;
        pNVar6 = (Node *)0x0;
        pNVar8 = pNVar12;
      }
      pNVar12->Next = pNVar6;
      pNVar12 = pNVar8;
    }
    if (pNVar11 == (Node *)0x0) {
      return pNVar6;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar12->Pair).Key = key;
  return pNVar12;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}